

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O0

void __thiscall
Imf_3_2::PizCompressor::PizCompressor
          (PizCompressor *this,Header *hdr,size_t maxScanLineSize,size_t numScanLines)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  int iVar4;
  Header *pHVar5;
  unsigned_long uVar6;
  size_t sVar7;
  _func_int **pp_Var8;
  Box2i *pBVar9;
  undefined4 in_ECX;
  undefined4 in_EDX;
  Header *in_RSI;
  Compressor *in_RDI;
  ulong uVar10;
  Box2i *dataWindow;
  ConstIterator c;
  bool onlyHalfChannels;
  ChannelList *channels;
  size_t outBufferSize;
  size_t tmpBufferSize;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  ConstIterator *in_stack_ffffffffffffff10;
  Channel *in_stack_ffffffffffffff20;
  PixelType type;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  unsigned_long in_stack_ffffffffffffff30;
  
  Compressor::Compressor(in_RDI,in_RSI);
  in_RDI->_vptr_Compressor = (_func_int **)&PTR__PizCompressor_004c0ec0;
  *(undefined4 *)&in_RDI[1]._vptr_Compressor = in_EDX;
  *(undefined4 *)((long)&in_RDI[1]._vptr_Compressor + 4) = 1;
  *(undefined4 *)&in_RDI[1]._header = in_ECX;
  in_RDI[2]._vptr_Compressor = (_func_int **)0x0;
  in_RDI[2]._header = (Header *)0x0;
  *(undefined4 *)&in_RDI[3]._vptr_Compressor = 0;
  pHVar5 = (Header *)Header::channels((Header *)0x2459eb);
  in_RDI[3]._header = pHVar5;
  in_RDI[4]._vptr_Compressor = (_func_int **)0x0;
  uiMult<unsigned_long>
            (in_stack_ffffffffffffff30,CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28)
            );
  uiMult<unsigned_long>
            (in_stack_ffffffffffffff30,CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28)
            );
  uVar6 = uiAdd<unsigned_long>
                    (in_stack_ffffffffffffff30,
                     CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  sVar7 = checkArraySize<unsigned_long>
                    (in_stack_ffffffffffffff30,
                     CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  uVar10 = sVar7 * 2;
  if (CARRY8(sVar7,sVar7)) {
    uVar10 = 0xffffffffffffffff;
  }
  pp_Var8 = (_func_int **)operator_new__(uVar10);
  in_RDI[2]._vptr_Compressor = pp_Var8;
  pHVar5 = (Header *)operator_new__(uVar6);
  in_RDI[2]._header = pHVar5;
  Compressor::header(in_RDI);
  Header::channels((Header *)0x245afe);
  bVar2 = true;
  ChannelList::begin((ChannelList *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  while( true ) {
    type = (PixelType)((ulong)in_stack_ffffffffffffff20 >> 0x20);
    ChannelList::end((ChannelList *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    bVar3 = Imf_3_2::operator!=(in_stack_ffffffffffffff10,
                                (ConstIterator *)
                                CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (!bVar3) break;
    *(int *)&in_RDI[3]._vptr_Compressor = *(int *)&in_RDI[3]._vptr_Compressor + 1;
    in_stack_ffffffffffffff20 = ChannelList::ConstIterator::channel((ConstIterator *)0x245b9b);
    if (in_stack_ffffffffffffff20->type != HALF) {
      bVar2 = false;
    }
    ChannelList::ConstIterator::operator++(in_stack_ffffffffffffff10);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*(int *)&in_RDI[3]._vptr_Compressor;
  uVar10 = SUB168(auVar1 * ZEXT816(0x20),0);
  if (SUB168(auVar1 * ZEXT816(0x20),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pp_Var8 = (_func_int **)operator_new__(uVar10);
  in_RDI[4]._vptr_Compressor = pp_Var8;
  pBVar9 = Header::dataWindow((Header *)0x245c35);
  *(int *)&in_RDI[4]._header = (pBVar9->min).x;
  *(int *)((long)&in_RDI[4]._header + 4) = (pBVar9->max).x;
  *(int *)&in_RDI[5]._vptr_Compressor = (pBVar9->max).y;
  if (bVar2) {
    iVar4 = pixelTypeSize(type);
    if (iVar4 == 2) {
      *(undefined4 *)((long)&in_RDI[1]._vptr_Compressor + 4) = 0;
    }
  }
  return;
}

Assistant:

PizCompressor::PizCompressor (
    const Header& hdr, size_t maxScanLineSize, size_t numScanLines)
    : Compressor (hdr)
    , _maxScanLineSize (maxScanLineSize)
    , _format (XDR)
    , _numScanLines (numScanLines)
    , _tmpBuffer (0)
    , _outBuffer (0)
    , _numChans (0)
    , _channels (hdr.channels ())
    , _channelData (0)
{
    // TODO: Remove this when we can change the ABI
    (void) _maxScanLineSize;
    size_t tmpBufferSize = uiMult (maxScanLineSize, numScanLines) / 2;

    size_t outBufferSize =
        uiAdd (uiMult (maxScanLineSize, numScanLines), size_t (65536 + 8192));

    _tmpBuffer = new unsigned short[checkArraySize (
        tmpBufferSize, sizeof (unsigned short))];

    _outBuffer = new char[outBufferSize];

    const ChannelList& channels         = header ().channels ();
    bool               onlyHalfChannels = true;

    for (ChannelList::ConstIterator c = channels.begin (); c != channels.end ();
         ++c)
    {
        _numChans++;

        assert (pixelTypeSize (c.channel ().type) % pixelTypeSize (HALF) == 0);

        if (c.channel ().type != HALF) onlyHalfChannels = false;
    }

    _channelData = new ChannelData[_numChans];

    const Box2i& dataWindow = hdr.dataWindow ();

    _minX = dataWindow.min.x;
    _maxX = dataWindow.max.x;
    _maxY = dataWindow.max.y;

    //
    // We can support uncompressed data in the machine's native format
    // if all image channels are of type HALF, and if the Xdr and the
    // native representations of a half have the same size.
    //

    if (onlyHalfChannels && (sizeof (half) == pixelTypeSize (HALF)))
        _format = NATIVE;
}